

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalDependencyList::VerifyDependencies
          (LogicalDependencyList *this,Catalog *catalog,string *name)

{
  DependencyException *this_00;
  bool bVar1;
  __node_base *p_Var2;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  p_Var2 = &(this->set)._M_h._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      return;
    }
    bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var2 + 10),&(catalog->db->super_CatalogEntry).name);
  } while (!bVar1);
  this_00 = (DependencyException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "Error adding dependency for object \"%s\" - dependency \"%s\" is in catalog \"%s\", which does not match the catalog \"%s\".\nCross catalog dependencies are not supported."
             ,&local_d1);
  ::std::__cxx11::string::string((string *)&local_70,(string *)name);
  ::std::__cxx11::string::string((string *)&local_90,(string *)(p_Var2 + 6));
  ::std::__cxx11::string::string((string *)&local_b0,(string *)(p_Var2 + 10));
  ::std::__cxx11::string::string
            ((string *)&local_d0,(string *)&(catalog->db->super_CatalogEntry).name);
  DependencyException::
  DependencyException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_50,&local_70,&local_90,&local_b0,&local_d0);
  __cxa_throw(this_00,&DependencyException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LogicalDependencyList::VerifyDependencies(Catalog &catalog, const string &name) {
	for (auto &dep : set) {
		if (dep.catalog != catalog.GetName()) {
			throw DependencyException(
			    "Error adding dependency for object \"%s\" - dependency \"%s\" is in catalog "
			    "\"%s\", which does not match the catalog \"%s\".\nCross catalog dependencies are not supported.",
			    name, dep.entry.name, dep.catalog, catalog.GetName());
		}
	}
}